

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conn.c
# Opt level: O0

int conn_connect(conn_handle *conn,char *addr,char *port)

{
  int iVar1;
  int *piVar2;
  char *local_88;
  int local_74;
  addrinfo *paStack_70;
  int ret;
  addrinfo *res_remote;
  addrinfo *res;
  addrinfo hints;
  conn_priv *priv;
  char *port_local;
  char *addr_local;
  conn_handle *conn_local;
  
  hints.ai_next = (addrinfo *)conn->priv;
  res_remote = (addrinfo *)0x0;
  paStack_70 = (addrinfo *)0x0;
  if (conn->type == CONN_TYPE_TCP) {
    memset(&res,0,0x30);
    res._4_4_ = 2;
    res._0_4_ = 1;
    hints.ai_flags = 1;
    if (conn->source_port == (char *)0x0) {
      local_88 = "0";
    }
    else {
      local_88 = conn->source_port;
    }
    iVar1 = getaddrinfo(conn->source_addr,local_88,(addrinfo *)&res,(addrinfo **)&res_remote);
    if (iVar1 == 0) {
      memset(&res,0,0x30);
      res._4_4_ = 0;
      hints.ai_flags = 1;
      iVar1 = getaddrinfo(addr,port,(addrinfo *)&res,&stack0xffffffffffffff90);
      if (iVar1 == 0) {
        iVar1 = socket(res_remote->ai_family,res_remote->ai_socktype,res_remote->ai_protocol);
        (hints.ai_next)->ai_flags = iVar1;
        if ((hints.ai_next)->ai_flags == -1) {
          piVar2 = __errno_location();
          local_74 = -*piVar2;
        }
        else {
          iVar1 = setsockopt((hints.ai_next)->ai_flags,1,2,&conn_connect::yes,4);
          if (iVar1 == -1) {
            piVar2 = __errno_location();
            local_74 = -*piVar2;
          }
          else {
            iVar1 = bind((hints.ai_next)->ai_flags,(sockaddr *)res_remote->ai_addr,
                         res_remote->ai_addrlen);
            if (iVar1 == -1) {
              piVar2 = __errno_location();
              local_74 = *piVar2;
            }
            else {
              iVar1 = connect((hints.ai_next)->ai_flags,paStack_70->ai_addr,paStack_70->ai_addrlen);
              if (iVar1 != -1) {
                freeaddrinfo(paStack_70);
                freeaddrinfo((addrinfo *)res_remote);
                mutex_lock((mutex_handle *)(hints.ai_next + 3));
                (hints.ai_next)->ai_socktype = (hints.ai_next)->ai_flags;
                mutex_unlock((mutex_handle *)(hints.ai_next + 3));
                return 0;
              }
              piVar2 = __errno_location();
              local_74 = *piVar2;
            }
            local_74 = -local_74;
            shutdown((hints.ai_next)->ai_flags,2);
            close((hints.ai_next)->ai_flags);
            (hints.ai_next)->ai_flags = -1;
          }
        }
      }
      else {
        local_74 = -99;
      }
    }
    else {
      local_74 = -99;
    }
    if (paStack_70 != (addrinfo *)0x0) {
      freeaddrinfo(paStack_70);
    }
    if (res_remote != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)res_remote);
    }
    conn_local._4_4_ = local_74;
  }
  else {
    conn_local._4_4_ = -0x5b;
  }
  return conn_local._4_4_;
}

Assistant:

int conn_connect(struct conn_handle *conn, const char *addr,
		 const char *port)
{
	struct conn_priv *priv = conn->priv;
	struct addrinfo hints;
	struct addrinfo *res = NULL;
	struct addrinfo *res_remote = NULL;
	static const int yes = 1;
	int ret;

	if (conn->type != CONN_TYPE_TCP)
		return -EPROTOTYPE;

	memset(&hints, 0x0, sizeof(hints));

	hints.ai_family = AF_INET;
	hints.ai_flags = AI_PASSIVE;
	hints.ai_socktype = SOCK_STREAM;

	ret = getaddrinfo(conn->source_addr, conn->source_port == NULL ? "0" :
			  conn->source_port, &hints, &res);
	if (ret != 0) {
		ret = -EADDRNOTAVAIL;
		goto conn_connect_free_early;
	}

	memset(&hints, 0x0, sizeof(hints));

	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;

	ret = getaddrinfo(addr, port, &hints, &res_remote);
	if (ret != 0) {
		ret = -EADDRNOTAVAIL;
		goto conn_connect_free_early;
	}

	priv->sock_fd = socket(res->ai_family, res->ai_socktype,
			       res->ai_protocol);
	if (priv->sock_fd == INVALID_SOCKET) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}

	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_REUSEADDR,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}

#ifdef __APPLE__
	ret = setsockopt(priv->sock_fd, SOL_SOCKET, SO_NOSIGPIPE,
			 (const void *)&yes, sizeof(yes));
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free_early;
	}
#endif

	ret = bind(priv->sock_fd, res->ai_addr, (socklen_t)res->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free;
	}

	ret = connect(priv->sock_fd, res_remote->ai_addr,
		      (socklen_t)res_remote->ai_addrlen);
	if (ret == SOCKET_ERROR) {
		ret = SOCK_ERRNO;
		goto conn_connect_free;
	}

	freeaddrinfo(res_remote);
	freeaddrinfo(res);

	mutex_lock(&priv->mutex);

	priv->fd = priv->sock_fd;

	mutex_unlock(&priv->mutex);

	return 0;

conn_connect_free:
	shutdown(priv->sock_fd, SHUT_RDWR);

	closesocket(priv->sock_fd);

	priv->sock_fd = INVALID_SOCKET;

conn_connect_free_early:
	if (res_remote != NULL)
		freeaddrinfo(res_remote);

	if (res != NULL)
		freeaddrinfo(res);

	return ret;
}